

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O3

int CVmObjList::getp_maxVal(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *in_argc)

{
  vm_rcdesc rc;
  vm_rcdesc local_70;
  
  vm_rcdesc::init(&local_70,(EVP_PKEY_CTX *)"List.maxVal");
  get_minmax(retval,self_val,lst,in_argc,&local_70,1,0);
  return 1;
}

Assistant:

int CVmObjList::getp_maxVal(VMG_ vm_val_t *retval,
                            const vm_val_t *self_val,
                            const char *lst, uint *in_argc)
{
    /* do the general calculation to select the maximum value ("+1") */
    vm_rcdesc rc(vmg_ "List.maxVal", self_val, 32, G_stk->get(0),
                 in_argc != 0 ? *in_argc : 0);
    return get_minmax(vmg_ retval, self_val, lst, in_argc, &rc, 1, FALSE);
}